

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table-utils.h
# Opt level: O2

void __thiscall wasm::TableUtils::FlatTable::FlatTable(FlatTable *this,Module *wasm,Table *table)

{
  anon_class_16_2_f8897cbb visitor;
  
  (this->names).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->names).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->names).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->valid = true;
  visitor.table = table;
  visitor.this = this;
  ModuleUtils::
  iterTableSegments<wasm::TableUtils::FlatTable::FlatTable(wasm::Module&,wasm::Table&)::_lambda(wasm::ElementSegment*)_1_>
            (wasm,(Name)(table->super_Importable).super_Named.name.super_IString.str,visitor);
  return;
}

Assistant:

FlatTable(Module& wasm, Table& table) {
    valid = true;
    ModuleUtils::iterTableSegments(
      wasm, table.name, [&](ElementSegment* segment) {
        auto offset = segment->offset;
        if (!offset->is<Const>() || !segment->type.isFunction()) {
          // TODO: handle some non-constant segments
          valid = false;
          return;
        }
        Index start = offset->cast<Const>()->value.getInteger();
        Index size = segment->data.size();
        Index end;
        if (std::ckd_add(&end, start, size) || end > table.initial) {
          // Overflow.
          valid = false;
          return;
        }
        if (end > names.size()) {
          names.resize(end);
        }
        ElementUtils::iterElementSegmentFunctionNames(
          segment, [&](Name entry, Index i) { names[start + i] = entry; });
      });
  }